

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_tensor_layout.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateTensorViewResultTypeNV
          (ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  DiagnosticStream *pDVar2;
  string local_230;
  char *local_210;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *result_type;
  uint result_type_id;
  int result_type_index;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  result_type._4_4_ = 0;
  _result_type_id = inst;
  inst_local = (Instruction *)_;
  result_type._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)result_type);
  if ((local_30 != (Instruction *)0x0) &&
     (OVar1 = Instruction::opcode(local_30), OVar1 == OpTypeTensorViewNV)) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_result_type_id);
  OVar1 = Instruction::opcode(_result_type_id);
  local_210 = spvOpcodeString(OVar1);
  pDVar2 = DiagnosticStream::operator<<(&local_208,&local_210);
  pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [19])0x57c0db);
  ValidationState_t::getIdName_abi_cxx11_
            (&local_230,(ValidationState_t *)inst_local,(uint)result_type);
  pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_230);
  pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [28])" is not a tensor view type.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
  std::__cxx11::string::~string((string *)&local_230);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTensorViewResultTypeNV(ValidationState_t& _,
                                            const Instruction* inst) {
  const auto result_type_index = 0;
  const auto result_type_id = inst->GetOperandAs<uint32_t>(result_type_index);
  const auto result_type = _.FindDef(result_type_id);

  if (!result_type || spv::Op::OpTypeTensorViewNV != result_type->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(result_type_id) << " is not a tensor view type.";
  }
  return SPV_SUCCESS;
}